

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_auto_choose_color
               (LodePNGColorMode *mode_out,uchar *image,uint w,uint h,LodePNGColorMode *mode_in)

{
  sbyte sVar1;
  LodePNGColorType LVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  LodePNGColorProfile local_450;
  
  local_450.alpha = 0;
  local_450.numcolors = 0;
  local_450.colored = 0;
  local_450.key._0_2_ = 0;
  local_450.key._2_2_ = 0;
  local_450.key_r = 0;
  local_450.key_g = 0;
  local_450.key_b = 0;
  local_450.bits = 1;
  lodepng_get_color_profile(&local_450,image,w,h,mode_in);
  mode_out->key_defined = 0;
  uVar3 = h * w;
  if (uVar3 < 0x11 && CONCAT22(local_450.key._2_2_,(undefined2)local_450.key) != 0) {
    uVar8 = 8;
    if (8 < local_450.bits) {
      uVar8 = local_450.bits;
    }
    bVar10 = true;
    local_450.bits = uVar8;
  }
  else {
    bVar10 = local_450.alpha != 0;
  }
  uVar9 = (ulong)local_450.numcolors;
  if (uVar9 < 3) {
    uVar8 = 1;
  }
  else if (local_450.numcolors < 5) {
    uVar8 = 2;
  }
  else {
    uVar8 = (uint)(0x10 < local_450.numcolors) * 4 + 4;
    if (0x100 < local_450.numcolors) {
      bVar7 = true;
      goto LAB_0036d18e;
    }
  }
  bVar7 = 8 < local_450.bits || uVar3 <= local_450.numcolors * 2;
LAB_0036d18e:
  if (((uVar3 < local_450.numcolors * 2) ||
      ((bool)(~(local_450.colored != 0 | bVar10) & local_450.bits <= uVar8))) || (bVar7)) {
    bVar7 = local_450.colored != 0;
    mode_out->bitdepth = local_450.bits;
    LVar2 = (uint)bVar7 * 2;
    if (bVar10) {
      LVar2 = bVar7 + 4 + (uint)bVar7;
    }
    mode_out->colortype = LVar2;
    uVar3 = 0;
    if (CONCAT22(local_450.key._2_2_,(undefined2)local_450.key) != 0 && !bVar10) {
      bVar4 = (byte)local_450.bits;
      sVar1 = (bVar4 < 0x21) * (' ' - bVar4);
      mode_out->key_r = ((uint)local_450.key_r << sVar1) >> sVar1;
      sVar1 = (bVar4 < 0x21) * (' ' - bVar4);
      mode_out->key_g = ((uint)local_450.key_g << sVar1) >> sVar1;
      sVar1 = (bVar4 < 0x21) * (' ' - bVar4);
      mode_out->key_b = ((uint)local_450.key_b << sVar1) >> sVar1;
      mode_out->key_defined = 1;
    }
  }
  else {
    lodepng_palette_clear(mode_out);
    uVar6 = 0;
    do {
      uVar3 = 0;
      if (uVar9 * 4 + 4 == uVar6 + 4) break;
      iVar5 = (int)uVar6;
      uVar3 = lodepng_palette_add(mode_out,local_450.palette[uVar6 & 0xffffffff],
                                  local_450.palette[iVar5 + 1],local_450.palette[iVar5 + 2],
                                  local_450.palette[iVar5 + 3]);
      uVar6 = uVar6 + 4;
    } while (uVar3 == 0);
    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = uVar8;
    if (((mode_in->colortype == LCT_PALETTE) && (mode_out->palettesize <= mode_in->palettesize)) &&
       (mode_in->bitdepth == uVar8)) {
      lodepng_palette_clear(mode_out);
      lodepng_color_mode_copy(mode_out,mode_in);
    }
  }
  return uVar3;
}

Assistant:

unsigned lodepng_auto_choose_color(LodePNGColorMode* mode_out,
                                   const unsigned char* image, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode_in)
{
  LodePNGColorProfile prof;
  unsigned error = 0;
  unsigned i, n, palettebits, grey_ok, palette_ok;

  lodepng_color_profile_init(&prof);
  error = lodepng_get_color_profile(&prof, image, w, h, mode_in);
  if(error) return error;
  mode_out->key_defined = 0;

  if(prof.key && w * h <= 16)
  {
    prof.alpha = 1; /*too few pixels to justify tRNS chunk overhead*/
    if(prof.bits < 8) prof.bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
  }
  grey_ok = !prof.colored && !prof.alpha; /*grey without alpha, with potentially low bits*/
  n = prof.numcolors;
  palettebits = n <= 2 ? 1 : (n <= 4 ? 2 : (n <= 16 ? 4 : 8));
  palette_ok = n <= 256 && (n * 2 < w * h) && prof.bits <= 8;
  if(w * h < n * 2) palette_ok = 0; /*don't add palette overhead if image has only a few pixels*/
  if(grey_ok && prof.bits <= palettebits) palette_ok = 0; /*grey is less overhead*/

  if(palette_ok)
  {
    unsigned char* p = prof.palette;
    lodepng_palette_clear(mode_out); /*remove potential earlier palette*/
    for(i = 0; i != prof.numcolors; ++i)
    {
      error = lodepng_palette_add(mode_out, p[i * 4 + 0], p[i * 4 + 1], p[i * 4 + 2], p[i * 4 + 3]);
      if(error) break;
    }

    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = palettebits;

    if(mode_in->colortype == LCT_PALETTE && mode_in->palettesize >= mode_out->palettesize
        && mode_in->bitdepth == mode_out->bitdepth)
    {
      /*If input should have same palette colors, keep original to preserve its order and prevent conversion*/
      lodepng_color_mode_cleanup(mode_out);
      lodepng_color_mode_copy(mode_out, mode_in);
    }
  }
  else /*8-bit or 16-bit per channel*/
  {
    mode_out->bitdepth = prof.bits;
    mode_out->colortype = prof.alpha ? (prof.colored ? LCT_RGBA : LCT_GREY_ALPHA)
                                     : (prof.colored ? LCT_RGB : LCT_GREY);

    if(prof.key && !prof.alpha)
    {
      unsigned mask = (1u << mode_out->bitdepth) - 1u; /*profile always uses 16-bit, mask converts it*/
      mode_out->key_r = prof.key_r & mask;
      mode_out->key_g = prof.key_g & mask;
      mode_out->key_b = prof.key_b & mask;
      mode_out->key_defined = 1;
    }
  }

  return error;
}